

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O0

int32_t __thiscall icu_63::BytesTrie::getNextBytes(BytesTrie *this,ByteSink *out)

{
  byte *pbVar1;
  uint local_2c;
  byte *pbStack_28;
  int32_t node;
  uint8_t *pos;
  ByteSink *out_local;
  BytesTrie *this_local;
  
  pbVar1 = this->pos_;
  if (pbVar1 == (byte *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (this->remainingMatchLength_ < 0) {
    pbStack_28 = pbVar1 + 1;
    local_2c = (uint)*pbVar1;
    if (0x1f < local_2c) {
      if ((*pbVar1 & 1) != 0) {
        return 0;
      }
      pbVar1 = skipValue(pbStack_28,local_2c);
      pbStack_28 = pbVar1 + 1;
      local_2c = (uint)*pbVar1;
    }
    if (local_2c < 0x10) {
      if (local_2c == 0) {
        local_2c = (uint)*pbStack_28;
        pbStack_28 = pbStack_28 + 1;
      }
      this_local._4_4_ = local_2c + 1;
      getNextBranchBytes(pbStack_28,this_local._4_4_,out);
    }
    else {
      append(out,(uint)*pbStack_28);
      this_local._4_4_ = 1;
    }
  }
  else {
    append(out,(uint)*pbVar1);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
BytesTrie::getNextBytes(ByteSink &out) const {
    const uint8_t *pos=pos_;
    if(pos==NULL) {
        return 0;
    }
    if(remainingMatchLength_>=0) {
        append(out, *pos);  // Next byte of a pending linear-match node.
        return 1;
    }
    int32_t node=*pos++;
    if(node>=kMinValueLead) {
        if(node&kValueIsFinal) {
            return 0;
        } else {
            pos=skipValue(pos, node);
            node=*pos++;
            U_ASSERT(node<kMinValueLead);
        }
    }
    if(node<kMinLinearMatch) {
        if(node==0) {
            node=*pos++;
        }
        getNextBranchBytes(pos, ++node, out);
        return node;
    } else {
        // First byte of the linear-match node.
        append(out, *pos);
        return 1;
    }
}